

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

void gray_record_cell(PWorker worker)

{
  int iVar1;
  long lVar2;
  long lVar3;
  PCell_conflict pTVar4;
  PCell_conflict pTVar5;
  int iVar6;
  long lVar7;
  TArea TVar8;
  PCell *ppTVar9;
  
  lVar2 = worker->area;
  iVar1 = worker->cover;
  if (lVar2 != 0 || iVar1 != 0) {
    lVar7 = worker->count_ex;
    if (worker->ex < worker->count_ex) {
      lVar7 = worker->ex;
    }
    ppTVar9 = worker->ycells + worker->ey;
    while ((pTVar5 = *ppTVar9, pTVar5 != (PCell_conflict)0x0 && (pTVar5->x <= lVar7))) {
      if (lVar7 == pTVar5->x) {
        TVar8 = pTVar5->area;
        iVar6 = pTVar5->cover;
        goto LAB_00116d07;
      }
      ppTVar9 = &pTVar5->next;
    }
    lVar3 = worker->num_cells;
    if (worker->max_cells <= lVar3) {
      longjmp((__jmp_buf_tag *)worker->jump_buffer,1);
    }
    pTVar4 = worker->cells;
    worker->num_cells = lVar3 + 1;
    pTVar4[lVar3].x = (int)lVar7;
    pTVar4[lVar3].area = 0;
    pTVar4[lVar3].cover = 0;
    pTVar4[lVar3].next = pTVar5;
    pTVar5 = pTVar4 + lVar3;
    *ppTVar9 = pTVar5;
    iVar6 = 0;
    TVar8 = 0;
LAB_00116d07:
    pTVar5->area = TVar8 + lVar2;
    pTVar5->cover = iVar6 + iVar1;
  }
  return;
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    if ( ras.area | ras.cover )
    {
      PCell  cell = gray_find_cell( RAS_VAR );


      cell->area  += ras.area;
      cell->cover += ras.cover;
    }
  }